

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

uint FindNextPattern(uchar *buffer,uint size,uint offset,uchar *pattern,uint size_of_pattern)

{
  byte bVar1;
  byte bVar2;
  int iVar9;
  void *__s2;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uchar *__s1;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  __s2 = operator_new__((ulong)(size_of_pattern * 8));
  if (size_of_pattern != 0) {
    uVar10 = 0;
    lVar11 = 0;
    do {
      iVar9 = (int)lVar11;
      bVar1 = pattern[uVar10];
      lVar11 = (long)iVar9 + 8;
      bVar8 = bVar1 >> 1;
      bVar7 = bVar1 >> 2;
      bVar6 = bVar1 >> 3;
      bVar5 = bVar1 >> 4;
      bVar4 = bVar1 >> 5;
      bVar3 = bVar1 >> 6;
      bVar2 = -((char)bVar1 >> 7);
      bVar2 = (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2);
      bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
      bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
      bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      bVar1 = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
      *(ulong *)((long)__s2 + (long)iVar9) =
           CONCAT17((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                    CONCAT16((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                             CONCAT15((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                      CONCAT14((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                               (0xff < bVar6),
                                               CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                        (0xff < bVar5),
                                                        CONCAT12((bVar4 != 0) * (bVar4 < 0x100) *
                                                                 bVar4 - (0xff < bVar4),
                                                                 CONCAT11((bVar3 != 0) *
                                                                          (bVar3 < 0x100) * bVar3 -
                                                                          (0xff < bVar3),
                                                                          (bVar2 != 0) *
                                                                          (bVar2 < 0x100) * bVar2 -
                                                                          (0xff < bVar2)))))))) &
           0x101010101010101;
      uVar10 = uVar10 + 1;
    } while (size_of_pattern != uVar10);
  }
  if (offset < size) {
    __s1 = buffer + offset;
    uVar12 = offset;
    do {
      offset = uVar12;
      iVar9 = bcmp(__s1,__s2,(ulong)(size_of_pattern * 8));
      if (iVar9 == 0) break;
      uVar12 = offset + 1;
      __s1 = __s1 + 1;
      offset = size;
    } while (size != uVar12);
  }
  operator_delete__(__s2);
  uVar12 = 0xffffffff;
  if (offset != size) {
    uVar12 = offset;
  }
  return uVar12;
}

Assistant:

unsigned int FindNextPattern(unsigned char* buffer, unsigned int size, unsigned int offset,
                             const unsigned char* pattern, unsigned int size_of_pattern)
{
   // Convert pattern to bit array
   unsigned char* pattern_in_bits = new unsigned char[size_of_pattern * 8];
   int index = 0;
   for (unsigned int i = 0; i < size_of_pattern; i++)
   {
      for (int j = 0; j < 8; j++)
      {
         unsigned char c = ((pattern[i] >> (7 - j)) & 0x01);
         pattern_in_bits[index++] = c;
      }
   }

   // Find this array

   while (offset < size && memcmp(&buffer[offset], pattern_in_bits, size_of_pattern * 8) != 0)
   {
      ++offset;
   }

   delete[]pattern_in_bits;

   if (offset == size) return -1;
   return offset;
}